

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_a40::GetNoiseSpectrum
               (int noise_size,int fft_size,ForwardRealFFT *forward_real_fft,RandnState *randn_state
               )

{
  double dVar1;
  fft_plan p;
  double *in_stack_ffffffffffffff80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  int local_34;
  int local_30;
  int i_2;
  int i_1;
  int i;
  double average;
  RandnState *randn_state_local;
  ForwardRealFFT *forward_real_fft_local;
  int fft_size_local;
  int noise_size_local;
  
  _i_1 = 0.0;
  for (i_2 = 0; i_2 < noise_size; i_2 = i_2 + 1) {
    dVar1 = randn(randn_state);
    forward_real_fft->waveform[i_2] = dVar1;
    _i_1 = forward_real_fft->waveform[i_2] + _i_1;
  }
  for (local_30 = 0; local_34 = noise_size, local_30 < noise_size; local_30 = local_30 + 1) {
    forward_real_fft->waveform[local_30] =
         forward_real_fft->waveform[local_30] - _i_1 / (double)noise_size;
  }
  for (; local_34 < fft_size; local_34 = local_34 + 1) {
    forward_real_fft->waveform[local_34] = 0.0;
  }
  memcpy(&stack0xffffffffffffff80,&forward_real_fft->forward_fft,0x48);
  p._8_8_ = local_70;
  p._0_8_ = uStack_78;
  p.c_in = (fft_complex *)uStack_68;
  p.in = (double *)local_60;
  p.c_out = (fft_complex *)uStack_58;
  p.out = (double *)local_50;
  p.input = (double *)uStack_48;
  p.ip = (int *)local_40;
  p.w = in_stack_ffffffffffffff80;
  fft_execute(p);
  return;
}

Assistant:

static void GetNoiseSpectrum(int noise_size, int fft_size,
    const ForwardRealFFT *forward_real_fft, RandnState *randn_state) {
  double average = 0.0;
  for (int i = 0; i < noise_size; ++i) {
    forward_real_fft->waveform[i] = randn(randn_state);
    average += forward_real_fft->waveform[i];
  }

  average /= noise_size;
  for (int i = 0; i < noise_size; ++i)
    forward_real_fft->waveform[i] -= average;
  for (int i = noise_size; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
}